

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolk.c
# Opt level: O3

int fffr4int(float *input,long ntodo,double scale,double zero,int nullcheck,int nullval,
            char *nullarray,int *anynull,int *output,int *status)

{
  float fVar1;
  ushort uVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      if (0 < ntodo) {
        lVar5 = 0;
        do {
          dVar6 = (double)input[lVar5] * scale + zero;
          if (-2147483648.49 <= dVar6) {
            if (dVar6 <= 2147483647.49) {
              iVar4 = (int)dVar6;
            }
            else {
              *status = -0xb;
              iVar4 = 0x7fffffff;
            }
          }
          else {
            *status = -0xb;
            iVar4 = -0x80000000;
          }
          output[lVar5] = iVar4;
          lVar5 = lVar5 + 1;
        } while (ntodo != lVar5);
      }
    }
    else if (0 < ntodo) {
      lVar5 = 0;
      do {
        fVar1 = input[lVar5];
        if (-2.1474836e+09 <= fVar1) {
          if (fVar1 <= 2.1474836e+09) {
            iVar4 = (int)fVar1;
          }
          else {
            *status = -0xb;
            iVar4 = 0x7fffffff;
          }
        }
        else {
          *status = -0xb;
          iVar4 = -0x80000000;
        }
        output[lVar5] = iVar4;
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    if (0 < ntodo) {
      lVar5 = 0;
      do {
        uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
        cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
        if ((uVar2 & 0x7f80) == 0x7f80) {
          cVar3 = '\x01';
        }
        if (cVar3 == '\0') {
          dVar6 = (double)input[lVar5] * scale + zero;
          if (dVar6 < -2147483648.49) {
LAB_00153ea8:
            *status = -0xb;
            output[lVar5] = -0x80000000;
          }
          else if (2147483647.49 < dVar6) {
LAB_00153ec5:
            *status = -0xb;
            output[lVar5] = 0x7fffffff;
          }
          else {
            output[lVar5] = (int)dVar6;
          }
        }
        else if (cVar3 == '\x01') {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar5] = nullval;
          }
          else {
            nullarray[lVar5] = '\x01';
          }
        }
        else {
          if (zero < -2147483648.49) goto LAB_00153ea8;
          if (2147483647.49 < zero) goto LAB_00153ec5;
          output[lVar5] = (int)zero;
        }
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (0 < ntodo) {
    lVar5 = 0;
    do {
      uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
      cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar3 = '\x01';
      }
      if (cVar3 == '\0') {
        fVar1 = input[lVar5];
        if (-2.1474836e+09 <= fVar1) {
          if (fVar1 <= 2.1474836e+09) {
            output[lVar5] = (int)fVar1;
          }
          else {
            *status = -0xb;
            output[lVar5] = 0x7fffffff;
          }
        }
        else {
          *status = -0xb;
          output[lVar5] = -0x80000000;
        }
      }
      else if (cVar3 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else {
        output[lVar5] = 0;
      }
      lVar5 = lVar5 + 1;
    } while (ntodo != lVar5);
  }
  return *status;
}

Assistant:

int fffr4int(float *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            int  nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            int  *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MIN;
                }
                else if (input[ii] > DINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MAX;
                }
                else
                    output[ii] = (int) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MIN;
                }
                else if (dvalue > DINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MAX;
                }
                else
                    output[ii] = (int) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MIN;
                    }
                    else if (input[ii] > DINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MAX;
                    }
                    else
                        output[ii] = (int) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  { 
                    if (zero < DINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MIN;
                    }
                    else if (zero > DINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MAX;
                    }
                    else
                      output[ii] = (int) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MIN;
                    }
                    else if (dvalue > DINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MAX;
                    }
                    else
                        output[ii] = (int) dvalue;
                }
            }
        }
    }
    return(*status);
}